

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O3

VertexIter __thiscall CMU462::HalfedgeMesh::newVertex(HalfedgeMesh *this)

{
  size_t *psVar1;
  _Node *p_Var2;
  Vertex local_108;
  
  local_108.index = 0;
  local_108.isNew = false;
  local_108._89_3_ = 0;
  local_108.offset = 0.0;
  local_108.velocity = 0.0;
  local_108._100_4_ = 0;
  local_108.super_HalfedgeElement._vptr_HalfedgeElement = (_func_int **)&PTR_centroid_0026bda8;
  local_108.position.x = 0.0;
  local_108.position.y = 0.0;
  local_108.position.z = 0.0;
  local_108.bindPosition.x = 0.0;
  local_108.bindPosition.y = 0.0;
  local_108.bindPosition.z = 0.0;
  local_108.newPosition.x = 0.0;
  local_108.newPosition.y = 0.0;
  local_108.newPosition.z = 0.0;
  memset(&local_108.quadric,0,0x88);
  p_Var2 = std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::
           _M_create_node<CMU462::Vertex>(&this->vertices,&local_108);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  psVar1 = &(this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return (VertexIter)&p_Var2->super__List_node_base;
}

Assistant:

VertexIter newVertex() {
          return vertices.insert(vertices.end(), Vertex());
        }